

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void moveresults(lua_State *L,StkId res,int nres,l_uint32 fwanted)

{
  StkId pSVar1;
  long lVar2;
  ptrdiff_t savedres;
  int wanted;
  TValue *io2;
  TValue *io1;
  l_uint32 fwanted_local;
  int nres_local;
  StkId res_local;
  lua_State *L_local;
  
  if (fwanted == 0) {
    genmoveresults(L,res,nres,nres);
  }
  else if (fwanted == 1) {
    (L->top).p = res;
  }
  else if (fwanted == 2) {
    if (nres == 0) {
      (res->val).tt_ = '\0';
    }
    else {
      pSVar1 = (L->top).p;
      (res->val).value_ = pSVar1[-(long)nres].val.value_;
      (res->val).tt_ = pSVar1[-(long)nres].val.tt_;
    }
    (L->top).p = res + 1;
  }
  else {
    savedres._4_4_ = (fwanted & 0xff) - 1;
    _fwanted_local = res;
    if ((fwanted & 0x40000) != 0) {
      (L->ci->u2).funcidx = nres;
      L->ci->callstatus = L->ci->callstatus | 0x20000;
      _fwanted_local = luaF_close(L,res,'\x06',1);
      L->ci->callstatus = L->ci->callstatus & 0xfffdffff;
      if (L->hookmask != 0) {
        lVar2 = (L->stack).offset;
        rethook(L,L->ci,nres);
        _fwanted_local = (StkId)((long)(L->stack).p + ((long)_fwanted_local - lVar2));
      }
      if (savedres._4_4_ == -1) {
        savedres._4_4_ = nres;
      }
    }
    genmoveresults(L,_fwanted_local,nres,savedres._4_4_);
  }
  return;
}

Assistant:

l_sinline void moveresults (lua_State *L, StkId res, int nres,
                                          l_uint32 fwanted) {
  switch (fwanted) {  /* handle typical cases separately */
    case 0 + 1:  /* no values needed */
      L->top.p = res;
      return;
    case 1 + 1:  /* one value needed */
      if (nres == 0)   /* no results? */
        setnilvalue(s2v(res));  /* adjust with nil */
      else  /* at least one result */
        setobjs2s(L, res, L->top.p - nres);  /* move it to proper place */
      L->top.p = res + 1;
      return;
    case LUA_MULTRET + 1:
      genmoveresults(L, res, nres, nres);  /* we want all results */
      break;
    default: {  /* two/more results and/or to-be-closed variables */
      int wanted = get_nresults(fwanted);
      if (fwanted & CIST_TBC) {  /* to-be-closed variables? */
        L->ci->u2.nres = nres;
        L->ci->callstatus |= CIST_CLSRET;  /* in case of yields */
        res = luaF_close(L, res, CLOSEKTOP, 1);
        L->ci->callstatus &= ~CIST_CLSRET;
        if (L->hookmask) {  /* if needed, call hook after '__close's */
          ptrdiff_t savedres = savestack(L, res);
          rethook(L, L->ci, nres);
          res = restorestack(L, savedres);  /* hook can move stack */
        }
        if (wanted == LUA_MULTRET)
          wanted = nres;  /* we want all results */
      }
      genmoveresults(L, res, nres, wanted);
      break;
    }
  }
}